

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_TaprootAddressFromHashTest_Test::~Address_TaprootAddressFromHashTest_Test
          (Address_TaprootAddressFromHashTest_Test *this)

{
  Address_TaprootAddressFromHashTest_Test *this_local;
  
  ~Address_TaprootAddressFromHashTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Address, TaprootAddressFromHashTest) {
  try {
    const ByteData pubkey = ByteData(
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
    Address address;
    address = Address(NetType::kMainnet, WitnessVersion::kVersion1, pubkey);
    EXPECT_STREQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kMainnet, address.GetNetType());
    EXPECT_EQ(AddressType::kTaprootAddress, address.GetAddressType());
    EXPECT_EQ(WitnessVersion::kVersion1, address.GetWitnessVersion());
    EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
                address.GetHash().GetHex().c_str());
    EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
                address.GetSchnorrPubkey().GetHex().c_str());
    EXPECT_STREQ("", address.GetScript().GetHex().c_str());
    EXPECT_STREQ("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        address.GetLockingScript().GetHex().c_str());

    address = Address(NetType::kTestnet, WitnessVersion::kVersion1, pubkey);
    EXPECT_STREQ("tb1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naskf8ee6",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kTestnet, address.GetNetType());

    address = Address(NetType::kRegtest, WitnessVersion::kVersion1, pubkey);
    EXPECT_STREQ("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}